

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_delete.cpp
# Opt level: O1

unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true> __thiscall
duckdb::PhysicalDelete::GetGlobalSinkState(PhysicalDelete *this,ClientContext *context)

{
  TableCatalogEntry *table;
  DeleteGlobalState *this_00;
  ClientContext *in_RDX;
  
  table = (TableCatalogEntry *)(context->config).profiler_settings._M_h._M_buckets;
  this_00 = (DeleteGlobalState *)operator_new(0x210);
  DeleteGlobalState::DeleteGlobalState
            (this_00,in_RDX,(vector<duckdb::LogicalType,_true> *)&context->registered_state,table,
             (vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
              *)&(context->config).profiler_settings._M_h._M_before_begin);
  (this->super_PhysicalOperator)._vptr_PhysicalOperator = (_func_int **)this_00;
  return (unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>)
         (unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>)this;
}

Assistant:

unique_ptr<GlobalSinkState> PhysicalDelete::GetGlobalSinkState(ClientContext &context) const {
	return make_uniq<DeleteGlobalState>(context, GetTypes(), tableref, bound_constraints);
}